

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::StrictMock<MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::StrictMock
          (StrictMock<MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_> *this)

{
  undefined8 *in_RDI;
  
  MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::MockSolWriter
            ((MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)0x2232f0);
  *in_RDI = &PTR__StrictMock_003a1170;
  internal::ImplicitCast_<MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>>>*>
            ((MockSolWriter<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)(in_RDI + 1));
  Mock::FailUninterestingCalls((void *)0x223310);
  return;
}

Assistant:

StrictMock() {
    ::testing::Mock::FailUninterestingCalls(
        internal::ImplicitCast_<MockClass*>(this));
  }